

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path_test.cpp
# Opt level: O0

void __thiscall
portability_path_test_portability_path_test_path_get_module_name_Test::
~portability_path_test_portability_path_test_path_get_module_name_Test
          (portability_path_test_portability_path_test_path_get_module_name_Test *this)

{
  void *in_RDI;
  
  ~portability_path_test_portability_path_test_path_get_module_name_Test
            ((portability_path_test_portability_path_test_path_get_module_name_Test *)0x121988);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST_F(portability_path_test, portability_path_test_path_get_module_name)
{
	static const char base[] = "/a/b/c/asd.txt";
	static const char result[] = "asd";
	static const char extension[] = "txt";

	string_name name;

	size_t size = portability_path_get_module_name(base, sizeof(base), extension, sizeof(extension), name, NAME_SIZE);

	EXPECT_EQ((int)0, (int)strcmp(name, result));
	EXPECT_EQ((size_t)size, (size_t)sizeof(result));
	EXPECT_EQ((char)'\0', (char)result[size - 1]);
}